

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigInter.c
# Opt level: O0

void Aig_ManInterFast(Aig_Man_t *pManOn,Aig_Man_t *pManOff,int fVerbose)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  void *pvVar3;
  int local_5c;
  int i;
  int status;
  int Lits [3];
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnfOff;
  Cnf_Dat_t *pCnfOn;
  sat_solver *pSat;
  int fVerbose_local;
  Aig_Man_t *pManOff_local;
  Aig_Man_t *pManOn_local;
  
  iVar1 = Aig_ManCiNum(pManOn);
  iVar2 = Aig_ManCiNum(pManOff);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(pManOn) == Aig_ManCiNum(pManOff)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                  ,0x3b,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManCoNum(pManOn);
  iVar2 = Aig_ManCoNum(pManOff);
  if (iVar1 == iVar2) {
    iVar1 = Aig_ManCoNum(pManOn);
    pManOn->nRegs = iVar1;
    iVar1 = Aig_ManCoNum(pManOn);
    p = Cnf_Derive(pManOn,iVar1);
    pManOn->nRegs = 0;
    iVar1 = Aig_ManCoNum(pManOn);
    pManOff->nRegs = iVar1;
    iVar1 = Aig_ManCoNum(pManOff);
    p_00 = Cnf_Derive(pManOff,iVar1);
    pManOff->nRegs = 0;
    Cnf_DataLift(p_00,p->nVars);
    s = sat_solver_new();
    sat_solver_setnvars(s,p->nVars + p_00->nVars);
    for (local_5c = 0; local_5c < p->nClauses; local_5c = local_5c + 1) {
      iVar1 = sat_solver_addclause(s,p->pClauses[local_5c],p->pClauses[local_5c + 1]);
      if (iVar1 == 0) {
        Cnf_DataFree(p);
        Cnf_DataFree(p_00);
        sat_solver_delete(s);
        return;
      }
    }
    local_5c = 0;
    while( true ) {
      if (p_00->nClauses <= local_5c) {
        local_5c = 0;
        while( true ) {
          iVar1 = Vec_PtrSize(pManOn->vCis);
          if (iVar1 <= local_5c) {
            iVar1 = sat_solver_simplify(s);
            if (iVar1 != 0) {
              for (local_5c = 0; iVar1 = Vec_PtrSize(pManOn->vCos), local_5c < iVar1;
                  local_5c = local_5c + 1) {
                pvVar3 = Vec_PtrEntry(pManOn->vCos,local_5c);
                Lits._4_8_ = Aig_ManCo(pManOff,local_5c);
                i = toLitCond(p->pVarNums[*(int *)((long)pvVar3 + 0x24)],0);
                status = toLitCond(p_00->pVarNums[*(int *)(Lits._4_8_ + 0x24)],0);
                iVar1 = sat_solver_solve(s,&i,Lits,0,0,0,0);
                if (iVar1 != -1) {
                  printf("The incremental SAT problem is not UNSAT.\n");
                }
              }
              Cnf_DataFree(p);
              Cnf_DataFree(p_00);
              sat_solver_delete(s);
              return;
            }
            __assert_fail("status != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                          ,0x77,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
          }
          pvVar3 = Vec_PtrEntry(pManOn->vCis,local_5c);
          Lits._4_8_ = Aig_ManCi(pManOff,local_5c);
          i = toLitCond(p->pVarNums[*(int *)((long)pvVar3 + 0x24)],0);
          status = toLitCond(p_00->pVarNums[*(int *)(Lits._4_8_ + 0x24)],1);
          iVar1 = sat_solver_addclause(s,&i,Lits);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                          ,0x70,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
          }
          i = toLitCond(p->pVarNums[*(int *)((long)pvVar3 + 0x24)],1);
          status = toLitCond(p_00->pVarNums[*(int *)(Lits._4_8_ + 0x24)],0);
          iVar1 = sat_solver_addclause(s,&i,Lits);
          if (iVar1 == 0) break;
          local_5c = local_5c + 1;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                      ,0x74,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
      }
      iVar1 = sat_solver_addclause(s,p_00->pClauses[local_5c],p_00->pClauses[local_5c + 1]);
      if (iVar1 == 0) break;
      local_5c = local_5c + 1;
    }
    Cnf_DataFree(p);
    Cnf_DataFree(p_00);
    sat_solver_delete(s);
    return;
  }
  __assert_fail("Aig_ManCoNum(pManOn) == Aig_ManCoNum(pManOff)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                ,0x3c,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
}

Assistant:

void Aig_ManInterFast( Aig_Man_t * pManOn, Aig_Man_t * pManOff, int fVerbose )
{
    sat_solver * pSat;
    Cnf_Dat_t * pCnfOn, * pCnfOff;
    Aig_Obj_t * pObj, * pObj2;
    int Lits[3], status, i;
//    abctime clk = Abc_Clock();

    assert( Aig_ManCiNum(pManOn) == Aig_ManCiNum(pManOff) );
    assert( Aig_ManCoNum(pManOn) == Aig_ManCoNum(pManOff) );

    // derive CNFs
    pManOn->nRegs = Aig_ManCoNum(pManOn);
    pCnfOn  = Cnf_Derive( pManOn, Aig_ManCoNum(pManOn) );
    pManOn->nRegs = 0;

    pManOff->nRegs = Aig_ManCoNum(pManOn);
    pCnfOff = Cnf_Derive( pManOff, Aig_ManCoNum(pManOff) );
    pManOff->nRegs = 0;

//    pCnfOn  = Cnf_DeriveSimple( pManOn, Aig_ManCoNum(pManOn) );
//    pCnfOff = Cnf_DeriveSimple( pManOff, Aig_ManCoNum(pManOn) );
    Cnf_DataLift( pCnfOff, pCnfOn->nVars );

    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnfOn->nVars + pCnfOff->nVars );

    // add clauses of A
    for ( i = 0; i < pCnfOn->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnfOn->pClauses[i], pCnfOn->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnfOn );
            Cnf_DataFree( pCnfOff );
            sat_solver_delete( pSat );
            return;
        }
    }

    // add clauses of B
    for ( i = 0; i < pCnfOff->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnfOff->pClauses[i], pCnfOff->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnfOn );
            Cnf_DataFree( pCnfOff );
            sat_solver_delete( pSat );
            return;
        }
    }

    // add PI clauses
    // collect the common variables
    Aig_ManForEachCi( pManOn, pObj, i )
    {
        pObj2 = Aig_ManCi( pManOff, i );

        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 0 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 1 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    status = sat_solver_simplify( pSat );
    assert( status != 0 );

    // solve incremental SAT problems
    Aig_ManForEachCo( pManOn, pObj, i )
    {
        pObj2 = Aig_ManCo( pManOff, i );

        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 0 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 0 );
        status = sat_solver_solve( pSat, Lits, Lits+2, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status != l_False )
            printf( "The incremental SAT problem is not UNSAT.\n" );
    }
    Cnf_DataFree( pCnfOn );
    Cnf_DataFree( pCnfOff );
    sat_solver_delete( pSat );
//    ABC_PRT( "Fast interpolation time", Abc_Clock() - clk );
}